

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

int find_rung_proc(Am_Object *self)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object local_50 [4];
  int parent_rung;
  Am_Object parent;
  Am_Object local_38 [8];
  Am_Value_List local_30 [8];
  Am_Value_List nodes;
  int rank;
  int parent_rank;
  Am_Object *self_local;
  
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)PARENT);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  if (iVar3 == iVar2) {
    self_local._4_4_ = 0;
  }
  else {
    Am_Object::Get_Owner(local_38,(Am_Slot_Flags)self);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_38,0x82);
    Am_Value_List::Am_Value_List(local_30,pAVar4);
    Am_Object::~Am_Object(local_38);
    bVar1 = Am_Value_List::Valid();
    if ((bVar1 & 1) == 0) {
      self_local._4_4_ = 0;
    }
    else {
      pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_30);
      Am_Object::Am_Object(local_50,pAVar4);
      pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_50,(ulong)RUNG);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      self_local._4_4_ = iVar2 + 1;
      Am_Object::~Am_Object(local_50);
    }
    Am_Value_List::~Am_Value_List(local_30);
  }
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, find_rung)
{
  int parent_rank = self.Get(PARENT);
  int rank = self.Get(Am_RANK);
  if (rank == parent_rank)
    return 0;
  Am_Value_List nodes = self.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  if (nodes.Valid()) {
    Am_Object parent = nodes.Get_Nth(parent_rank);
    int parent_rung = parent.Get(RUNG);
    return parent_rung + 1;
  }
  return 0;
}